

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O2

int __thiscall
vkt::tessellation::anon_unknown_1::IOBlock::numBasicSubobjectsInElementType(IOBlock *this)

{
  pointer pMVar1;
  int iVar2;
  ulong uVar3;
  anon_unknown_1 *this_00;
  int iVar4;
  VarType *in_RSI;
  ulong uVar5;
  bool bVar6;
  
  pMVar1 = (this->m_members).
           super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->m_members).
                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1) / 0x38;
  iVar4 = 0;
  uVar5 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar5 = 0;
  }
  this_00 = (anon_unknown_1 *)&pMVar1->type;
  while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
    iVar2 = numBasicSubobjects(this_00,in_RSI);
    iVar4 = iVar4 + iVar2;
    this_00 = this_00 + 0x38;
  }
  return iVar4;
}

Assistant:

int IOBlock::numBasicSubobjectsInElementType (void) const
{
	int result = 0;
	for (int i = 0; i < static_cast<int>(m_members.size()); ++i)
		result += numBasicSubobjects(m_members[i].type);
	return result;
}